

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O2

void oggpackB_writetrunc(oggpack_buffer *b,long bits)

{
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  
  if (b->ptr != (uchar *)0x0) {
    lVar2 = bits >> 3;
    uVar3 = (uint)bits & 7;
    b->ptr = b->buffer + lVar2;
    b->endbit = uVar3;
    b->endbyte = lVar2;
    pbVar1 = b->buffer + lVar2;
    *pbVar1 = *pbVar1 & (byte)mask8B[uVar3];
  }
  return;
}

Assistant:

void oggpackB_writetrunc(oggpack_buffer *b,long bits){
  long bytes=bits>>3;
  if(b->ptr){
    bits-=bytes*8;
    b->ptr=b->buffer+bytes;
    b->endbit=bits;
    b->endbyte=bytes;
    *b->ptr&=mask8B[bits];
  }
}